

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddTriangleProxy
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          ChVector<double> *p1,ChVector<double> *p2,ChVector<double> *p3,ChVector<double> *ep1,
          ChVector<double> *ep2,ChVector<double> *ep3,bool mowns_vertex_1,bool mowns_vertex_2,
          bool mowns_vertex_3,bool mowns_edge_1,bool mowns_edge_2,bool mowns_edge_3,
          double msphereswept_rad)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChCollisionShapeBullet *this_00;
  cbtCEtriangleShape *this_01;
  shared_ptr<chrono::ChMaterialSurface> local_a8;
  ChVector<double> *local_98;
  ChVector<double> *local_90;
  ChVector<double> *local_88;
  double local_80;
  ChMatrix33<double> local_78;
  
  local_88 = p1;
  local_80 = msphereswept_rad;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])();
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  local_a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var1 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ChCollisionShapeBullet::ChCollisionShapeBullet(this_00,TRIANGLE,&local_a8);
  local_98 = p3;
  local_90 = ep1;
  if (local_a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_01 = (cbtCEtriangleShape *)cbtAlignedAllocInternal(0x88,0x10);
  cbtCEtriangleShape::cbtCEtriangleShape
            (this_01,local_88,p2,local_98,local_90,ep2,ep3,mowns_vertex_1,mowns_vertex_2,
             mowns_vertex_3,mowns_edge_1,mowns_edge_2,mowns_edge_3,local_80);
  this_00->m_bt_shape = (cbtCollisionShape *)this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*(this_01->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xb])(this_01);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  injectShape(this,(ChVector<double> *)&VNULL,&local_78,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddTriangleProxy(std::shared_ptr<ChMaterialSurface> material,
                                              ChVector<>* p1,
                                              ChVector<>* p2,
                                              ChVector<>* p3,
                                              ChVector<>* ep1,
                                              ChVector<>* ep2,
                                              ChVector<>* ep3,
                                              bool mowns_vertex_1,
                                              bool mowns_vertex_2,
                                              bool mowns_vertex_3,
                                              bool mowns_edge_1,
                                              bool mowns_edge_2,
                                              bool mowns_edge_3,
                                              double msphereswept_rad) {
    // adjust default inward 'safe' margin (always as radius)
    SetSafeMargin(msphereswept_rad);

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::TRIANGLE, material);

    shape->m_bt_shape =
        new cbtCEtriangleShape(p1, p2, p3, ep1, ep2, ep3, mowns_vertex_1, mowns_vertex_2, mowns_vertex_3, mowns_edge_1,
                               mowns_edge_2, mowns_edge_3, msphereswept_rad);
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(VNULL, ChMatrix33<>(1), shape);
    return true;
}